

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void fill_suite::expand_fill_n_full(void)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin;
  iterator iVar1;
  initializer_list<int> __l;
  allocator_type local_91;
  iterator local_90;
  vector<int,_std::allocator<int>_> expect;
  int local_68 [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&span,4);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0x37;
  std::
  __fill_n_a<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,unsigned_long,int>
            (iVar1.parent,iVar1.current,span.member.cap);
  local_68[0] = 0x37;
  local_68[1] = 0x37;
  local_68[2] = 0x37;
  local_68[3] = 0x37;
  __l._M_len = 4;
  __l._M_array = local_68;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_91);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x10a,"void fill_suite::expand_fill_n_full()",iVar1,local_90,second_begin,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void expand_fill_n_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.expand_back(span.capacity());
    std::fill_n(span.begin(), span.capacity(), 55);
    {
        std::vector<int> expect = { 55, 55, 55, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}